

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

bool __thiscall GGSock::Communicator::Data::doConnect(Data *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  rep rVar4;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  time_point tEnd;
  int enable;
  int rc;
  time_point tStart;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffa8;
  type in_stack_ffffffffffffffb8;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  undefined8 local_38;
  int local_2c;
  duration<long,std::ratio<1l,1000l>> local_28 [8];
  undefined4 in_stack_ffffffffffffffe0;
  
  std::chrono::_V2::system_clock::now();
  while( true ) {
    if (((in_RDI->__d).__r & 0x1000000) == 0) {
      return false;
    }
    iVar2 = ::connect((int)in_RDI[2].__d.__r,(sockaddr *)(in_RDI + 6),0x10);
    if ((-1 < iVar2) || (bVar1 = anon_unknown.dwarf_7001::e_isConnected(), bVar1)) break;
    bVar1 = anon_unknown.dwarf_7001::e_inProgress();
    if ((!bVar1) && (bVar1 = anon_unknown.dwarf_7001::e_wouldBlock(), !bVar1)) {
      anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12e758);
      iVar3 = socket(2,1,6);
      *(int *)&in_RDI[2].__d.__r = iVar3;
      in_stack_ffffffffffffffe0 = 1;
      iVar3 = setsockopt((int)in_RDI[2].__d.__r,1,2,&stack0xffffffffffffffe0,4);
      if (iVar3 < 0) {
        fprintf(_stderr,"setsockopt(SO_REUSEADDR) failed");
      }
      iVar3 = setsockopt((int)in_RDI[2].__d.__r,1,0xf,&stack0xffffffffffffffe0,4);
      if (iVar3 < 0) {
        fprintf(_stderr,"setsockopt(SO_REUSEPORT) failed");
      }
      anon_unknown.dwarf_7001::setNonBlocking((TSocketDescriptor *)in_RDI);
    }
    if (*(int *)((long)&in_RDI[1].__d.__r + 4) < 1) {
      return false;
    }
    local_2c = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_28,&local_2c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    local_38 = std::chrono::_V2::system_clock::now();
    in_stack_ffffffffffffffb8 = std::chrono::operator-(in_stack_ffffffffffffffb8.__r,in_RDI);
    local_40.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffffa8);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_40);
    if (*(int *)((long)&in_RDI[1].__d.__r + 4) <= rVar4) {
      anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12e888);
      *(undefined1 *)((long)&(in_RDI->__d).__r + 3) = 0;
    }
  }
  *(TSocketDescriptor *)((long)&in_RDI[2].__d.__r + 4) = (TSocketDescriptor)in_RDI[2].__d.__r;
  printf("Connected successfully, sd = %d\n",(ulong)(uint)in_RDI[2].__d.__r);
  *(undefined1 *)((long)&(in_RDI->__d).__r + 3) = 0;
  *(undefined1 *)((long)&(in_RDI->__d).__r + 2) = 1;
  return true;
}

Assistant:

bool doConnect() {
            auto tStart = std::chrono::high_resolution_clock::now();

            while (isConnecting) {
                auto rc = ::connect(sd, (struct sockaddr *) &addr, sizeof(addr));
                if (rc < 0 && e_isConnected() == false) {
                    if (e_inProgress() == false && e_wouldBlock() == false) {
                        ::closeAndReset(sd);
                        sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);

                        int enable = 1;
                        if (setsockopt(sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
                            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
                        }

#ifndef _WIN32
                        if (setsockopt(sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
                            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
                        }
#endif

                        //{
                        //    linger lin;
                        //    lin.l_onoff = 0;
                        //    lin.l_linger = 0;
                        //    if (setsockopt(sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
                        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
                        //    }
                        //}

                        ::setNonBlocking(sd);
                    }
                    if (timeoutConnect_ms > 0) {
                        std::this_thread::sleep_for(std::chrono::milliseconds(1));

                        auto tEnd = std::chrono::high_resolution_clock::now();
                        if (std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count() >= timeoutConnect_ms) {
                            ::closeAndReset(sd);
                            isConnecting = false;
                        }
                        continue;
                    }

                    return false;
                }

                sdpeer = sd;

                printf("Connected successfully, sd = %d\n", sd);

                isConnecting = false;
                isConnected = true;

                return true;
            }

            return false;
        }